

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_LS.h
# Opt level: O2

void __thiscall fanuc_post_processor::generate_LS::read_pos(generate_LS *this)

{
  pointer paVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ulong uVar5;
  long lVar6;
  Vector3d eulerAngle;
  Quaterniond quaternion4;
  string local_78 [2];
  
  lVar6 = 0;
  uVar5 = 0;
  while( true ) {
    paVar1 = (this->pos_).
             super__Vector_base<std::array<double,_7UL>,_std::allocator<std::array<double,_7UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->pos_).
                       super__Vector_base<std::array<double,_7UL>,_std::allocator<std::array<double,_7UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)paVar1) / 0x38) <= uVar5)
    break;
    quaternion4.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[0] = *(double *)((long)paVar1->_M_elems + lVar6 + 0x18);
    quaternion4.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[1] = *(double *)((long)paVar1->_M_elems + lVar6 + 0x20);
    quaternion4.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[2] = *(double *)((long)paVar1->_M_elems + lVar6 + 0x28);
    quaternion4.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[3] = *(double *)((long)paVar1->_M_elems + lVar6 + 0x30);
    Eigen::QuaternionBase<Eigen::Quaternion<double,_0>_>::toRotationMatrix
              ((QuaternionBase<Eigen::Quaternion<double,_0>_> *)&quaternion4);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::eulerAngles
              (&eulerAngle,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_78,2,1,0);
    dVar4 = eulerAngle.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
            .array[2];
    dVar3 = eulerAngle.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
            .array[1];
    dVar2 = eulerAngle.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
            .array[0];
    std::__cxx11::string::append((char *)this);
    std::__cxx11::to_string(local_78,(int)uVar5 + 1);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::to_string
              (local_78,*(double *)
                         ((long)((this->pos_).
                                 super__Vector_base<std::array<double,_7UL>,_std::allocator<std::array<double,_7UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar6));
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::to_string
              (local_78,*(double *)
                         ((long)((this->pos_).
                                 super__Vector_base<std::array<double,_7UL>,_std::allocator<std::array<double,_7UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar6 + 8));
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::to_string
              (local_78,*(double *)
                         ((long)((this->pos_).
                                 super__Vector_base<std::array<double,_7UL>,_std::allocator<std::array<double,_7UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar6 + 0x10
                         ));
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::to_string(local_78,(dVar4 / 3.141592653589793) * 180.0);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::to_string(local_78,(dVar3 / 3.141592653589793) * 180.0);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::to_string(local_78,(dVar2 / 3.141592653589793) * 180.0);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::string::append((char *)this);
    lVar6 = lVar6 + 0x38;
    uVar5 = uVar5 + 1;
  }
  return;
}

Assistant:

void generate_LS::read_pos() {
        for(int i = 0; i < pos_.size(); i++){
            Eigen::Quaterniond quaternion4(pos_[i][6],pos_[i][3],pos_[i][4],pos_[i][5]);
            Eigen::Vector3d eulerAngle = quaternion4.matrix().eulerAngles(2,1,0); // zyx
            double angle_W = eulerAngle[2]/M_PI*180;
            double angle_P = eulerAngle[1]/M_PI*180;
            double angle_R = eulerAngle[0]/M_PI*180;
            program.append("P[");
            program.append(std::to_string(i+1));
            program.append("]{");
            program.append("\n");
            program.append("   GP1:");
            program.append("\n");
            program.append("\tUF : 0, UT : 1,\t\tCONFIG : 'N U T, 0, 0, 0',");
            program.append("\n");
            program.append("\tX =\t");
            program.append(std::to_string(pos_[i][0]));
            program.append("\tmm,\tY =\t");
            program.append(std::to_string(pos_[i][1]));
            program.append("\tmm,\tZ =\t");
            program.append(std::to_string(pos_[i][2]));
            program.append("\tmm,");
            program.append("\n");
            // *********************** wpr = zyx？ *******************
            program.append("\tW =\t");
            program.append(std::to_string(angle_W));
            program.append("\tdeg,\tP =\t");
            program.append(std::to_string(angle_P));
            program.append("\tdeg,\tR =\t");
            program.append(std::to_string(angle_R));
            program.append("\tdeg");
            program.append("\n");
            program.append("};");
            program.append("\n");
        }

    }